

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O2

void SldTrackComments(void)

{
  pointer pbVar1;
  int pageNum;
  char *pcVar2;
  char *symbol;
  pointer pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> keyword;
  
  pbVar1 = sldCommentKeywords_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((eolComment != (char *)0x0) && (FP_SourceLevelDebugging != (FILE *)0x0)) &&
     (DeviceID != (char *)0x0)) {
    pbVar3 = sldCommentKeywords_abi_cxx11_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (*eolComment != '\0') {
      for (; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
        std::__cxx11::string::string((string *)&keyword,(string *)pbVar3);
        symbol = eolComment;
        pcVar2 = strstr(eolComment,keyword._M_dataplus._M_p);
        if (pcVar2 != (char *)0x0) {
          if (PseudoORG == DISP_NONE) {
            pageNum = Page->Number;
          }
          else {
            pageNum = dispPageNum;
            if (dispPageNum == -1) {
              pageNum = CDevice::GetPageOfA16(Device,CurAddress);
              symbol = eolComment;
            }
          }
          WriteToSldFile(pageNum,CurAddress,'K',symbol);
          std::__cxx11::string::~string((string *)&keyword);
          return;
        }
        std::__cxx11::string::~string((string *)&keyword);
      }
    }
    return;
  }
  __assert_fail("eolComment && IsSldExportActive()",
                "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/sjio.cpp"
                ,0x5cc,"void SldTrackComments()");
}

Assistant:

void SldTrackComments() {
	assert(eolComment && IsSldExportActive());
	if (!eolComment[0]) return;
	for (auto keyword : sldCommentKeywords) {
		if (strstr(eolComment, keyword.c_str())) {
			int pageNum = Page->Number;
			if (DISP_NONE != PseudoORG) {
				pageNum = LABEL_PAGE_UNDEFINED != dispPageNum ? dispPageNum : Device->GetPageOfA16(CurAddress);
			}
			WriteToSldFile(pageNum, CurAddress, 'K', eolComment);
			return;
		}
	}
}